

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O0

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,cmake *cm,bool isNew,int labelwidth,
          int entrywidth)

{
  pointer this_00;
  cmake *key_00;
  bool bVar1;
  CacheEntryType CVar2;
  cmCursesLabelWidget *pcVar3;
  cmState *pcVar4;
  cmCursesPathWidget *this_01;
  cmCursesWidget *pcVar5;
  cmCursesOptionsWidget *this_02;
  reference option;
  cmCursesStringWidget *pcVar6;
  char *pcVar7;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  iterator si;
  string local_158;
  undefined1 local_138 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  cmCursesOptionsWidget *ow;
  string local_110;
  char *local_f0;
  char *stringsProp;
  string local_e0;
  allocator local_b9;
  string local_b8;
  char *local_98;
  char *value;
  string local_88;
  undefined1 local_62;
  allocator local_61;
  string local_60;
  int local_2c;
  int local_28;
  int entrywidth_local;
  int labelwidth_local;
  bool isNew_local;
  cmake *cm_local;
  string *key_local;
  cmCursesCacheEntryComposite *this_local;
  
  local_2c = entrywidth;
  local_28 = labelwidth;
  entrywidth_local._3_1_ = isNew;
  _labelwidth_local = cm;
  cm_local = (cmake *)key;
  key_local = (string *)this;
  std::__cxx11::string::string((string *)&this->Key,(string *)key);
  this->LabelWidth = local_28;
  this->EntryWidth = local_2c;
  pcVar3 = (cmCursesLabelWidget *)operator_new(0x40);
  cmCursesLabelWidget::cmCursesLabelWidget(pcVar3,this->LabelWidth,1,1,1,(string *)cm_local);
  this->Label = pcVar3;
  if ((entrywidth_local._3_1_ & 1) == 0) {
    pcVar3 = (cmCursesLabelWidget *)operator_new(0x40);
    value._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88," ",(allocator *)((long)&value + 7));
    cmCursesLabelWidget::cmCursesLabelWidget(pcVar3,1,1,1,1,&local_88);
    value._6_1_ = 0;
    this->IsNewLabel = pcVar3;
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
  }
  else {
    pcVar3 = (cmCursesLabelWidget *)operator_new(0x40);
    local_62 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"*",&local_61);
    cmCursesLabelWidget::cmCursesLabelWidget(pcVar3,1,1,1,1,&local_60);
    local_62 = 0;
    this->IsNewLabel = pcVar3;
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  this->Entry = (cmCursesWidget *)0x0;
  pcVar4 = cmake::GetState(_labelwidth_local);
  local_98 = cmState::GetCacheEntryValue(pcVar4,(string *)cm_local);
  if (local_98 != (char *)0x0) {
    pcVar4 = cmake::GetState(_labelwidth_local);
    CVar2 = cmState::GetCacheEntryType(pcVar4,(string *)cm_local);
    switch(CVar2) {
    case BOOL:
      pcVar5 = (cmCursesWidget *)operator_new(0x40);
      cmCursesBoolWidget::cmCursesBoolWidget((cmCursesBoolWidget *)pcVar5,this->EntryWidth,1,1,1);
      this->Entry = pcVar5;
      bVar1 = cmSystemTools::IsOn(local_98);
      if (bVar1) {
        cmCursesBoolWidget::SetValueAsBool((cmCursesBoolWidget *)this->Entry,true);
      }
      else {
        cmCursesBoolWidget::SetValueAsBool((cmCursesBoolWidget *)this->Entry,false);
      }
      break;
    case PATH:
      this_01 = (cmCursesPathWidget *)operator_new(0xa0);
      cmCursesPathWidget::cmCursesPathWidget(this_01,this->EntryWidth,1,1,1);
      pcVar7 = local_98;
      this->Entry = (cmCursesWidget *)this_01;
      pcVar6 = (cmCursesStringWidget *)this->Entry;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,pcVar7,&local_b9);
      cmCursesStringWidget::SetString(pcVar6,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      break;
    case FILEPATH:
      pcVar5 = (cmCursesWidget *)operator_new(0xa0);
      cmCursesFilePathWidget::cmCursesFilePathWidget
                ((cmCursesFilePathWidget *)pcVar5,this->EntryWidth,1,1,1);
      pcVar7 = local_98;
      this->Entry = pcVar5;
      pcVar6 = (cmCursesStringWidget *)this->Entry;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,pcVar7,(allocator *)((long)&stringsProp + 7))
      ;
      cmCursesStringWidget::SetString(pcVar6,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&stringsProp + 7));
      break;
    case STRING:
      pcVar4 = cmake::GetState(_labelwidth_local);
      key_00 = cm_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,"STRINGS",(allocator *)((long)&ow + 7));
      pcVar7 = cmState::GetCacheEntryProperty(pcVar4,(string *)key_00,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ow + 7));
      local_f0 = pcVar7;
      if (pcVar7 == (char *)0x0) {
        pcVar6 = (cmCursesStringWidget *)operator_new(0x50);
        cmCursesStringWidget::cmCursesStringWidget(pcVar6,this->EntryWidth,1,1,1);
        pcVar7 = local_98;
        this->Entry = (cmCursesWidget *)pcVar6;
        pcVar6 = (cmCursesStringWidget *)this->Entry;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1b8,pcVar7,&local_1b9);
        cmCursesStringWidget::SetString(pcVar6,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
      else {
        this_02 = (cmCursesOptionsWidget *)operator_new(0x60);
        cmCursesOptionsWidget::cmCursesOptionsWidget(this_02,this->EntryWidth,1,1,1);
        this->Entry = (cmCursesWidget *)this_02;
        options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_02;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138);
        pcVar7 = local_f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_158,pcVar7,(allocator *)((long)&si._M_current + 7));
        cmSystemTools::ExpandListArgument
                  (&local_158,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138,false);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)((long)&si._M_current + 7));
        local_168._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_138);
        while( true ) {
          local_170._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_138);
          bVar1 = __gnu_cxx::operator!=(&local_168,&local_170);
          pcVar7 = local_98;
          this_00 = options.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (!bVar1) break;
          option = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_168);
          cmCursesOptionsWidget::AddOption((cmCursesOptionsWidget *)this_00,option);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_168);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_190,pcVar7,&local_191);
        cmCursesOptionsWidget::SetOption((cmCursesOptionsWidget *)this_00,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
      }
      break;
    default:
      break;
    case UNINITIALIZED:
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error("Found an undefined variable: ",pcVar7,(char *)0x0,(char *)0x0);
    }
    return;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CursesDialog/cmCursesCacheEntryComposite.cxx"
                ,0x37,
                "cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(const std::string &, cmake *, bool, int, int)"
               );
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
  const std::string& key, cmake *cm, bool isNew,
  int labelwidth, int entrywidth)
  : Key(key), LabelWidth(labelwidth), EntryWidth(entrywidth)
{
  this->Label = new cmCursesLabelWidget(this->LabelWidth, 1, 1, 1, key);
  if (isNew)
    {
    this->IsNewLabel = new cmCursesLabelWidget(1, 1, 1, 1, "*");
    }
  else
    {
    this->IsNewLabel = new cmCursesLabelWidget(1, 1, 1, 1, " ");
    }

  this->Entry = 0;
  const char* value = cm->GetState()->GetCacheEntryValue(key);
  assert(value);
  switch (cm->GetState()->GetCacheEntryType(key))
    {
    case cmState::BOOL:
      this->Entry = new cmCursesBoolWidget(this->EntryWidth, 1, 1, 1);
      if (cmSystemTools::IsOn(value))
        {
        static_cast<cmCursesBoolWidget*>(this->Entry)->SetValueAsBool(true);
        }
      else
        {
        static_cast<cmCursesBoolWidget*>(this->Entry)->SetValueAsBool(false);
        }
      break;
    case cmState::PATH:
      this->Entry = new cmCursesPathWidget(this->EntryWidth, 1, 1, 1);
      static_cast<cmCursesPathWidget*>(this->Entry)->SetString(value);
      break;
    case cmState::FILEPATH:
      this->Entry = new cmCursesFilePathWidget(this->EntryWidth, 1, 1, 1);
      static_cast<cmCursesFilePathWidget*>(this->Entry)->SetString(value);
      break;
    case cmState::STRING:
      {
      const char* stringsProp = cm->GetState()
                                  ->GetCacheEntryProperty(key, "STRINGS");
      if(stringsProp)
        {
        cmCursesOptionsWidget* ow =
          new cmCursesOptionsWidget(this->EntryWidth, 1, 1, 1);
        this->Entry = ow;
        std::vector<std::string> options;
        cmSystemTools::ExpandListArgument(stringsProp, options);
        for(std::vector<std::string>::iterator
              si = options.begin(); si != options.end(); ++si)
          {
          ow->AddOption(*si);
          }
        ow->SetOption(value);
        }
      else
        {
        this->Entry = new cmCursesStringWidget(this->EntryWidth, 1, 1, 1);
        static_cast<cmCursesStringWidget*>(this->Entry)->SetString(value);
        }
      break;
      }
    case cmState::UNINITIALIZED:
      cmSystemTools::Error("Found an undefined variable: ",
                           key.c_str());
      break;
    default:
      // TODO : put warning message here
      break;
    }

}